

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void elementDeclDebug(void *ctx,xmlChar *name,int type,xmlElementContentPtr content)

{
  undefined8 in_R8;
  undefined8 in_R9;
  xmlElementContentPtr content_local;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.elementDecl(%s, %d, ...)\n",name,(ulong)(uint)type,in_R8,in_R9,
            content);
  }
  return;
}

Assistant:

static void
elementDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, int type,
	    xmlElementContentPtr content ATTRIBUTE_UNUSED)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.elementDecl(%s, %d, ...)\n",
            name, type);
}